

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,void *src,size_t srcSize,
                 ZSTD_dictTableLoadMethod_e dtlm)

{
  BYTE *iend;
  BYTE *pBVar1;
  U32 UVar2;
  BYTE *pBVar3;
  ulong extraout_RAX;
  undefined4 extraout_var;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  U32 UVar4;
  ulong uVar5;
  
  iend = (BYTE *)((long)src + srcSize);
  pBVar1 = (ms->window).nextSrc;
  if (pBVar1 == (BYTE *)src) {
    pBVar3 = (ms->window).dictBase;
    UVar2 = (ms->window).lowLimit;
    uVar5 = (ulong)(ms->window).dictLimit;
  }
  else {
    pBVar3 = (ms->window).base;
    uVar5 = (long)pBVar1 - (long)pBVar3;
    UVar2 = (ms->window).dictLimit;
    (ms->window).lowLimit = UVar2;
    UVar4 = (U32)uVar5;
    (ms->window).dictLimit = UVar4;
    (ms->window).dictBase = pBVar3;
    (ms->window).base = (BYTE *)((long)src - uVar5);
    if (UVar4 - UVar2 < 8) {
      (ms->window).lowLimit = UVar4;
      UVar2 = UVar4;
    }
  }
  (ms->window).nextSrc = iend;
  if ((pBVar3 + UVar2 < iend) && (src < pBVar3 + (uVar5 & 0xffffffff))) {
    UVar2 = (U32)((long)iend - (long)pBVar3);
    if ((long)(uVar5 & 0xffffffff) < (long)iend - (long)pBVar3) {
      UVar2 = (U32)uVar5;
    }
    (ms->window).lowLimit = UVar2;
  }
  uVar5 = 0;
  if (params->forceWindow == 0) {
    uVar5 = (ulong)(uint)((int)iend - *(int *)&(ms->window).base);
  }
  ms->loadedDictEnd = (U32)uVar5;
  if (8 < srcSize) {
    uVar5 = (ulong)((params->cParams).strategy - ZSTD_fast);
    switch(uVar5) {
    case 0:
      ZSTD_fillHashTable(ms,iend,dtlm);
      uVar5 = extraout_RAX_00;
      break;
    case 1:
      ZSTD_fillDoubleHashTable(ms,iend,dtlm);
      uVar5 = extraout_RAX_01;
      break;
    case 2:
    case 3:
    case 4:
      UVar2 = ZSTD_insertAndFindFirstIndex(ms,iend + -8);
      uVar5 = CONCAT44(extraout_var,UVar2);
      break;
    case 5:
    case 6:
    case 7:
    case 8:
      ZSTD_updateTree(ms,iend + -8,iend);
      uVar5 = extraout_RAX;
    }
    ms->nextToUpdate = (int)iend - *(int *)&(ms->window).base;
  }
  return uVar5;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm)
{
    const BYTE* const ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;

    ZSTD_window_update(&ms->window, src, srcSize);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);

    /* Assert that we the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    if (srcSize <= HASH_READ_SIZE) return 0;

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, dtlm);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}